

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PythonDataType.h
# Opt level: O1

object __thiscall
anurbs::PythonDataType<anurbs::Model,_anurbs::Brep>::get
          (PythonDataType<anurbs::Model,_anurbs::Brep> *this,Model *model,string *key)

{
  handle hVar1;
  long *in_RCX;
  pair<const_void_*,_const_pybind11::detail::type_info_*> pVar2;
  undefined1 local_50 [16];
  shared_ptr<anurbs::EntryBase> *local_40;
  shared_ptr<anurbs::EntryBase> local_30;
  
  local_40 = &local_30;
  std::__cxx11::string::_M_construct<char*>((string *)&local_40,*in_RCX,in_RCX[1] + *in_RCX);
  Model::get<anurbs::Brep>((Model *)local_50,key);
  pVar2 = pybind11::detail::type_caster_generic::src_and_type
                    (local_50,(type_info *)&Ref<anurbs::Brep>::typeinfo,(type_info *)0x0);
  hVar1 = pybind11::detail::type_caster_generic::cast
                    (pVar2.first,copy,(handle)0x0,pVar2.second,
                     anon_func::anon_class_1_0_00000001::__invoke,
                     anon_func::anon_class_1_0_00000001::__invoke,(void *)0x0);
  (this->super_PythonDataTypeBase<anurbs::Model>)._vptr_PythonDataTypeBase =
       (_func_int **)hVar1.m_ptr;
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_50._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_50._8_8_);
  }
  if (local_40 != &local_30) {
    operator_delete(local_40,(ulong)((long)&(local_30.
                                             super___shared_ptr<anurbs::EntryBase,_(__gnu_cxx::_Lock_policy)2>
                                            ._M_ptr)->_vptr_EntryBase + 1));
  }
  return (object)(handle)this;
}

Assistant:

pybind11::object get(const TModel& model, const std::string& key)
        override
    {
        return pybind11::cast(model.template get<TData>(key));
    }